

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
pstore::broker::command_processor::process_command
          (command_processor *this,fifo_path *fifo,message_type *msg)

{
  pointer __lhs;
  bool bVar1;
  const_iterator pvVar2;
  const_iterator __last;
  tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
  *ptVar3;
  char **ppcVar4;
  function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *this_00;
  void *local_80;
  char *local_78;
  tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
  local_70;
  tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
  *local_48;
  tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
  *pos;
  pointer local_30;
  broker_command *c;
  unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
  command;
  message_type *msg_local;
  fifo_path *fifo_local;
  command_processor *this_local;
  
  command._M_t.
  super___uniq_ptr_impl<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
  .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
        )(__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
          )msg;
  parse((command_processor *)&c,(message_type *)this);
  local_30 = std::
             unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
             ::get((unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
                    *)&c);
  if (local_30 != (pointer)0x0) {
    (*this->_vptr_command_processor[9])(this,local_30);
    pvVar2 = std::
             begin<std::array<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>,6ul>>
                       ((array<std::tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>,_6UL>
                         *)commands_);
    __last = std::
             end<std::array<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>,6ul>>
                       ((array<std::tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>,_6UL>
                         *)commands_);
    local_78 = (char *)std::__cxx11::string::c_str();
    local_80 = (void *)0x0;
    std::
    tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    ::tuple<const_char_*,_std::nullptr_t,_true>(&local_70,&local_78,&local_80);
    ptVar3 = std::
             lower_bound<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const*,std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>,bool(*)(std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&,std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&)>
                       (pvVar2,__last,&local_70,command_entry_compare);
    std::
    tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    ::~tuple(&local_70);
    local_48 = ptVar3;
    pvVar2 = std::
             end<std::array<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>,6ul>>
                       ((array<std::tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>,_6UL>
                         *)commands_);
    __lhs = local_30;
    if (ptVar3 != pvVar2) {
      ppcVar4 = std::
                get<char_const*,char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>
                          (local_48);
      bVar1 = std::operator==(&__lhs->verb,*ppcVar4);
      if (bVar1) {
        this_00 = std::
                  get<std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>,char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>
                            (local_48);
        std::
        function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
        ::operator()(this_00,this,fifo,local_30);
        goto LAB_0013bb23;
      }
    }
    (*this->_vptr_command_processor[8])(this,local_30);
  }
LAB_0013bb23:
  std::
  unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>::
  ~unique_ptr((unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
               *)&c);
  return;
}

Assistant:

void command_processor::process_command (brokerface::fifo_path const & fifo,
                                                 brokerface::message_type const & msg) {
            auto const command = this->parse (msg);
            if (broker_command const * const c = command.get ()) {
                this->log (*c);
                auto const pos = std::lower_bound (std::begin (commands_), std::end (commands_),
                                                   command_entry (c->verb.c_str (), nullptr),
                                                   command_entry_compare);
                if (pos != std::end (commands_) && c->verb == std::get<gsl::czstring> (*pos)) {
                    std::get<handler> (*pos) (this, fifo, *c);
                } else {
                    this->unknown (*c);
                }
            }
        }